

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::RelativeTypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  CppType CVar1;
  EnumDescriptor *pEVar2;
  size_type sVar3;
  string type;
  string containing_type;
  string package;
  
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  if ((CVar1 != CPPTYPE_ENUM) &&
     (CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)this), CVar1 != CPPTYPE_MESSAGE)) {
    __assert_fail("field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM || field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                  ,0x4bf,
                  "std::string google::protobuf::compiler::js::(anonymous namespace)::RelativeTypeName(const FieldDescriptor *)"
                 );
  }
  std::__cxx11::string::string((string *)&package,*(string **)(*(long *)(this + 0x10) + 8));
  std::operator+(&containing_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)(*(long *)(this + 0x20) + 8) + 0x20),".");
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  if (CVar1 == CPPTYPE_ENUM) {
    pEVar2 = FieldDescriptor::enum_type((FieldDescriptor *)this);
  }
  else {
    pEVar2 = (EnumDescriptor *)FieldDescriptor::message_type((FieldDescriptor *)this);
  }
  std::__cxx11::string::string((string *)&type,(string *)(*(long *)(pEVar2 + 8) + 0x20));
  if (type._M_string_length < containing_type._M_string_length) {
    containing_type._M_string_length = type._M_string_length;
  }
  for (sVar3 = 0;
      (containing_type._M_string_length != sVar3 &&
      (type._M_dataplus._M_p[sVar3] == containing_type._M_dataplus._M_p[sVar3])); sVar3 = sVar3 + 1)
  {
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&type);
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&containing_type);
  std::__cxx11::string::~string((string *)&package);
  return __return_storage_ptr__;
}

Assistant:

std::string RelativeTypeName(const FieldDescriptor* field) {
  assert(field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM ||
         field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE);
  // For a field with an enum or message type, compute a name relative to the
  // path name of the message type containing this field.
  std::string package = field->file()->package();
  std::string containing_type = field->containing_type()->full_name() + ".";
  std::string type = (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM)
                         ? field->enum_type()->full_name()
                         : field->message_type()->full_name();

  // |prefix| is advanced as we find separators '.' past the common package
  // prefix that yield common prefixes in the containing type's name and this
  // type's name.
  int prefix = 0;
  for (int i = 0; i < type.size() && i < containing_type.size(); i++) {
    if (type[i] != containing_type[i]) {
      break;
    }
    if (type[i] == '.' && i >= package.size()) {
      prefix = i + 1;
    }
  }

  return type.substr(prefix);
}